

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiPartSharedAttributes.cpp
# Opt level: O0

void anon_unknown.dwarf_14e56a::testMultiPartOutputFileForExpectedFailure
               (vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_> *headers,string *fn,
               string *failMessage)

{
  char *__filename;
  ostream *poVar1;
  string *in_RDX;
  vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_> *in_RDI;
  ArgExc *e;
  MultiPartOutputFile file;
  bool caught;
  int in_stack_000001b4;
  bool in_stack_000001bb;
  int in_stack_000001bc;
  Header *in_stack_000001c0;
  char *in_stack_000001c8;
  MultiPartOutputFile *in_stack_000001d0;
  
  __filename = (char *)std::__cxx11::string::c_str();
  remove(__filename);
  std::__cxx11::string::c_str();
  std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::data
            ((vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_> *)0x1caac3);
  std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::size(in_RDI);
  Imf_2_5::globalThreadCount();
  Imf_2_5::MultiPartOutputFile::MultiPartOutputFile
            (in_stack_000001d0,in_stack_000001c8,in_stack_000001c0,in_stack_000001bc,
             in_stack_000001bb,in_stack_000001b4);
  poVar1 = std::operator<<((ostream *)&std::cerr,"ERROR -- ");
  poVar1 = std::operator<<(poVar1,in_RDX);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  __assert_fail("false",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartSharedAttributes.cpp"
                ,0xa2,
                "void (anonymous namespace)::testMultiPartOutputFileForExpectedFailure(const vector<Header> &, const std::string &, const string &)"
               );
}

Assistant:

void
testMultiPartOutputFileForExpectedFailure (const vector<Header> & headers,
                                           const std::string & fn,
                                           const string & failMessage="")
{
    bool caught = false;

    try
    {
        remove(fn.c_str());
        MultiPartOutputFile file(fn.c_str(), headers.data() , headers.size() );
        cerr << "ERROR -- " << failMessage << endl;
        assert (false);
    }
    catch (const IEX_NAMESPACE::ArgExc & e)
    {
        // expected behaviour
        caught = true;
    }
    assert (caught);
}